

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

int __thiscall RenX::Server::OnRehash(Server *this)

{
  unsigned_short uVar1;
  pointer puVar2;
  pointer puVar3;
  GameCommand *pGVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined8 uVar7;
  EVP_PKEY_CTX *ctx;
  socklen_t __len;
  pointer pcVar8;
  sockaddr *__addr;
  int __fd;
  pointer *__ptr;
  pointer puVar9;
  bool bVar10;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  string oldPass;
  string oldClientHostname;
  string oldHostname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar8 = (this->m_hostname)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar8,pcVar8 + (this->m_hostname)._M_string_length);
  pcVar8 = (this->m_clientHostname)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar8,pcVar8 + (this->m_clientHostname)._M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar8 = (this->m_pass)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar8,pcVar8 + (this->m_pass)._M_string_length);
  uVar1 = this->m_port;
  puVar2 = (this->m_commands).
           super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_commands).
           super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = puVar2;
  if (puVar3 != puVar2) {
    do {
      pGVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>.
               _M_t.
               super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>.
               super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl;
      if (pGVar4 != (GameCommand *)0x0) {
        (**(code **)((long)(pGVar4->super_Command)._vptr_Command + 0x10))();
      }
      (puVar9->_M_t).
      super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>._M_t.
      super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>.
      super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl = (GameCommand *)0x0;
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
    (this->m_commands).
    super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  getCore();
  uVar7 = Jupiter::Plugin::getConfig();
  ctx = (EVP_PKEY_CTX *)
        Jupiter::Config::getSection
                  (uVar7,(this->m_configSection)._M_string_length,
                   (this->m_configSection)._M_dataplus._M_p);
  init(this,ctx);
  if ((this->m_port == 0) || ((this->m_hostname)._M_string_length != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_hostname,&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_clientHostname,&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_pass,&local_90);
    this->m_port = uVar1;
  }
  else {
    lhs._M_str = local_50._M_dataplus._M_p;
    lhs._M_len = local_50._M_string_length;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->m_hostname)._M_dataplus._M_p;
    bVar6 = jessilib::equalsi<char,char>
                      (lhs,(basic_string_view<char,_std::char_traits<char>_>)(auVar5 << 0x40));
    bVar10 = uVar1 == this->m_port;
    __len = (socklen_t)CONCAT11((char)(uVar1 >> 8),bVar10);
    if (bVar6 && bVar10) {
      pcVar8 = (this->m_clientHostname)._M_dataplus._M_p;
      lhs_00._M_str = local_70._M_dataplus._M_p;
      lhs_00._M_len = local_70._M_string_length;
      rhs._M_str = pcVar8;
      rhs._M_len = (this->m_clientHostname)._M_string_length;
      bVar6 = jessilib::equalsi<char,char>(lhs_00,rhs);
      __len = (socklen_t)pcVar8;
      if (bVar6) {
        pcVar8 = (this->m_pass)._M_dataplus._M_p;
        lhs_01._M_str = local_90._M_dataplus._M_p;
        lhs_01._M_len = local_90._M_string_length;
        rhs_00._M_str = pcVar8;
        rhs_00._M_len = (this->m_pass)._M_string_length;
        bVar6 = jessilib::equalsi<char,char>(lhs_01,rhs_00);
        __len = (socklen_t)pcVar8;
        if (bVar6) goto LAB_001313a3;
      }
    }
    __fd = 0xb;
    disconnect(this,RehashReconnect);
    connect(this,__fd,__addr,__len);
  }
LAB_001313a3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int RenX::Server::OnRehash() {
	std::string oldHostname = m_hostname;
	std::string oldClientHostname = m_clientHostname;
	std::string oldPass = m_pass;
	unsigned short oldPort = m_port;
	int oldSteamFormat = m_steamFormat;
	m_commands.clear();
	init(*RenX::getCore()->getConfig().getSection(m_configSection));
	if (m_port == 0 || !m_hostname.empty()) {
		m_hostname = oldHostname;
		m_clientHostname = oldClientHostname;
		m_pass = oldPass;
		m_port = oldPort;
	}
	else if (!jessilib::equalsi(oldHostname, m_hostname)
		|| oldPort != m_port
		|| !jessilib::equalsi(oldClientHostname, m_clientHostname)
		|| !jessilib::equalsi(oldPass, m_pass)) {
		reconnect(RenX::DisconnectReason::Rehash);
	}

	return 0;
}